

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O0

bool DirectiveStartFunction(ArgumentList *List,int flags)

{
  CDirectiveFunction *this;
  Entry *name;
  CDirectiveFunction *func;
  int flags_local;
  ArgumentList *List_local;
  
  this = (CDirectiveFunction *)operator_new(0x18);
  name = ArgumentList::operator[](List,0);
  CDirectiveFunction::CDirectiveFunction(this,&name->text,Global.Section);
  AddAssemblerCommand((CAssemblerCommand *)this);
  return true;
}

Assistant:

bool DirectiveStartFunction(ArgumentList& List, int flags)
{
	CDirectiveFunction* func = new CDirectiveFunction(List[0].text,Global.Section);
	AddAssemblerCommand(func);
	return true;
}